

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O0

void __thiscall
QEvdevKeyboardManager::removeKeyboard(QEvdevKeyboardManager *this,QString *deviceNode)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  QString *in_RSI;
  QEvdevKeyboardManager *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffffa8;
  QEvdevKeyboardManager *this_00;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::remove
                    (&in_RDI->m_keyboards,(char *)in_RSI);
  if ((uVar2 & 1) != 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevKey();
    anon_unknown.dwarf_2baa8::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,in_stack_ffffffffffffffa8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_2baa8::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x106485);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20),
                 (char *)in_stack_ffffffffffffffa8,(char *)0x10649b);
      QtPrivate::asString(in_RSI);
      uVar3 = QString::utf16();
      QMessageLogger::debug(local_38,"Removing keyboard at %ls",uVar3);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    updateDeviceCount(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevKeyboardManager::removeKeyboard(const QString &deviceNode)
{
    if (m_keyboards.remove(deviceNode)) {
        qCDebug(qLcEvdevKey, "Removing keyboard at %ls", qUtf16Printable(deviceNode));
        updateDeviceCount();
    }
}